

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O2

Aig_Obj_t * Fra_ObjChild0Fra(Aig_Obj_t *pObj,int i)

{
  ulong uVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fra.h"
                  ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
  }
  uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  if (uVar1 != 0) {
    return (Aig_Obj_t *)
           ((ulong)((uint)pObj->pFanin0 & 1) ^
           *(ulong *)(*(long *)(*(long *)(uVar1 + 0x28) + 0x20) +
                     (long)(*(int *)(uVar1 + 0x24) * *(int *)(*(long *)(uVar1 + 0x28) + 0x18) + i) *
                     8));
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

static inline Aig_Obj_t *  Fra_ObjChild0Fra( Aig_Obj_t * pObj, int i ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Fra_ObjFraig(Aig_ObjFanin0(pObj),i), Aig_ObjFaninC0(pObj)) : NULL;  }